

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_L_invmult_inplace_p(m256v *LU,int rank,m256v *X_inout,int *placements)

{
  int r1;
  ulong uVar1;
  int rt;
  ulong uVar2;
  
  if (0 < rank) {
    uVar2 = 0;
    do {
      if (placements == (int *)0x0) {
        rt = (int)uVar2;
      }
      else {
        rt = placements[uVar2];
      }
      if (uVar2 != 0) {
        uVar1 = 0;
        do {
          if (placements == (int *)0x0) {
            r1 = (int)uVar1;
          }
          else {
            r1 = placements[uVar1];
          }
          m256v_multadd_row_from(X_inout,r1,0,LU->e[uVar1 + LU->rstride * uVar2],X_inout,rt);
          uVar1 = uVar1 + 1;
        } while (uVar2 != uVar1);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)rank);
  }
  return;
}

Assistant:

void MV_GEN_N(_L_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply L^(-1) */
	for (int i = 0; i < rank; ++i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = 0; j < i; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
					MV_GEN_N(_get_el)(LU, i, j),
					X_inout, pi);
		}
	}
}